

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O1

void __thiscall Wasm::WasmBinaryReader::ReadImportSection(WasmBinaryReader *this)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  uint sourceContextId;
  undefined4 *puVar5;
  char16 *pcVar6;
  char16 *pcVar7;
  ulong uVar8;
  WasmBinaryReader *pWVar9;
  FunctionBody *pFVar10;
  uint32 local_3c;
  uint32 local_38;
  uint32 len;
  uint32 modNameLen;
  uint32 fnNameLen;
  
  local_3c = 0;
  pWVar9 = this;
  uVar4 = LEB128<unsigned_int,32u>(this,&local_3c);
  if ((100000 < uVar4) && (DAT_015aa2e2 == '\0')) {
    ThrowDecodingError(pWVar9,L"Too many imports");
  }
  if (uVar4 == 0) {
    return;
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  local_38 = 0;
  len = 0;
  pcVar6 = ReadInlineName(this,&local_3c,&local_38);
  pcVar7 = ReadInlineName(this,&local_3c,&len);
  bVar2 = ReadConst<unsigned_char>(this);
  pFVar10 = (this->m_funcState).body;
  uVar8 = (ulong)bVar2;
  if (pFVar10 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
    pWVar9 = (WasmBinaryReader *)&DAT_015cd718;
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,WasmReaderPhase);
  }
  else {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
    if (this->m_readerState == READER_STATE_FUNCTION) {
      pFVar10 = (this->m_funcState).body;
    }
    else {
      pFVar10 = (FunctionBody *)0x0;
    }
    if ((pFVar10->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    pWVar9 = (WasmBinaryReader *)&DAT_015cd718;
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015cd718,WasmReaderPhase,sourceContextId,
                       ((pFVar10->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->functionId);
  }
  if (bVar3) {
    Output::Print(L"Import #%u: \"%s\".\"%s\", kind: %d",0,pcVar6,pcVar7,uVar8);
    pWVar9 = (WasmBinaryReader *)0xfcdf42;
    Output::Print(L"\n");
    Output::Flush();
  }
  if (bVar2 < 4) {
    (*(code *)(&DAT_011d4684 + *(int *)(&DAT_011d4684 + uVar8 * 4)))();
    return;
  }
  ThrowDecodingError(pWVar9,L"Imported Kind %d, NYI",uVar8);
}

Assistant:

void WasmBinaryReader::ReadImportSection()
{
    uint32 len = 0;
    uint32 numImports = LEB128(len);

    if (numImports > Limits::GetMaxImports())
    {
        ThrowDecodingError(_u("Too many imports"));
    }

    for (uint32 i = 0; i < numImports; ++i)
    {
        uint32 modNameLen = 0, fnNameLen = 0;
        const char16* modName = ReadInlineName(len, modNameLen);
        const char16* fnName = ReadInlineName(len, fnNameLen);

        ExternalKinds kind = ReadExternalKind();
        TRACE_WASM_DECODER(_u("Import #%u: \"%s\".\"%s\", kind: %d"), i, modName, fnName, kind);
        switch (kind)
        {
        case ExternalKinds::Function:
        {
            uint32 sigId = LEB128(len);
            m_module->AddFunctionImport(sigId, modName, modNameLen, fnName, fnNameLen);
            if (m_module->GetWasmFunctionCount() > Limits::GetMaxFunctions())
            {
                ThrowDecodingError(_u("Too many functions"));
            }
            break;
        }
        case ExternalKinds::Global:
        {
            WasmTypes::WasmType type = ReadWasmType(len);
            bool isMutable = ReadMutableValue();
            if (isMutable)
            {
                ThrowDecodingError(_u("Mutable globals cannot be imported"));
            }
            m_module->AddGlobal(GlobalReferenceTypes::ImportedReference, type, isMutable, {});
            m_module->AddGlobalImport(modName, modNameLen, fnName, fnNameLen);
            if (m_module->GetGlobalCount() > Limits::GetMaxGlobals())
            {
                ThrowDecodingError(_u("Too many globals"));
            }
            break;
        }
        case ExternalKinds::Table:
            ReadTableSection(true);
            m_module->AddTableImport(modName, modNameLen, fnName, fnNameLen);
            break;
        case ExternalKinds::Memory:
            ReadMemorySection(true);
            m_module->AddMemoryImport(modName, modNameLen, fnName, fnNameLen);

            break;
        default:
            ThrowDecodingError(_u("Imported Kind %d, NYI"), kind);
            break;
        }
    }
}